

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.h
# Opt level: O2

void __thiscall
TaskSpec::TaskSpec(TaskSpec *this,uint64_t id,string *conn_id,string *request_str,uint64_t epoch_ms,
                  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
                  *locks)

{
  this->id_ = id;
  std::__cxx11::string::string((string *)&this->conn_id_,(string *)conn_id);
  std::__cxx11::string::string((string *)&this->request_str_,(string *)request_str);
  this->epoch_ms_ = epoch_ms;
  (this->work_estimated_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->work_done_).super___atomic_base<unsigned_long>._M_i = 0;
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::vector(&this->locks_,locks);
  return;
}

Assistant:

TaskSpec(uint64_t id, std::string conn_id, std::string request_str,
             uint64_t epoch_ms, std::vector<DatabaseLock> locks)
        : id_(id),
          conn_id_(std::move(conn_id)),
          request_str_(std::move(request_str)),
          epoch_ms_(epoch_ms),
          work_estimated_(0),
          work_done_(0),
          locks_(locks) {}